

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AutoLoadExtensions(sqlite3 *db)

{
  sqlite3_mutex *p;
  sqlite3_api_routines *pThunk;
  sqlite3_mutex *mutex;
  char *zErrmsg;
  sqlite3_loadext_entry xInit;
  int local_18;
  int rc;
  int go;
  u32 i;
  sqlite3 *db_local;
  
  local_18 = 1;
  if (sqlite3Autoext.nExt != 0) {
    rc = 0;
    _go = db;
    while (local_18 != 0) {
      p = sqlite3MutexAlloc(2);
      sqlite3_mutex_enter(p);
      if ((uint)rc < sqlite3Autoext.nExt) {
        zErrmsg = (char *)sqlite3Autoext.aExt[(uint)rc];
      }
      else {
        zErrmsg = (char *)0x0;
        local_18 = 0;
      }
      sqlite3_mutex_leave(p);
      mutex = (sqlite3_mutex *)0x0;
      if ((zErrmsg != (char *)0x0) &&
         (xInit._4_4_ = (*(code *)zErrmsg)(_go,&mutex,0), xInit._4_4_ != 0)) {
        sqlite3ErrorWithMsg(_go,xInit._4_4_,"automatic extension loading failed: %s",mutex);
        local_18 = 0;
      }
      sqlite3_free(mutex);
      rc = rc + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoLoadExtensions(sqlite3 *db){
  u32 i;
  int go = 1;
  int rc;
  sqlite3_loadext_entry xInit;

  wsdAutoextInit;
  if( wsdAutoext.nExt==0 ){
    /* Common case: early out without every having to acquire a mutex */
    return;
  }
  for(i=0; go; i++){
    char *zErrmsg;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
#ifdef SQLITE_OMIT_LOAD_EXTENSION
    const sqlite3_api_routines *pThunk = 0;
#else
    const sqlite3_api_routines *pThunk = &sqlite3Apis;
#endif
    sqlite3_mutex_enter(mutex);
    if( i>=wsdAutoext.nExt ){
      xInit = 0;
      go = 0;
    }else{
      xInit = (sqlite3_loadext_entry)wsdAutoext.aExt[i];
    }
    sqlite3_mutex_leave(mutex);
    zErrmsg = 0;
    if( xInit && (rc = xInit(db, &zErrmsg, pThunk))!=0 ){
      sqlite3ErrorWithMsg(db, rc,
            "automatic extension loading failed: %s", zErrmsg);
      go = 0;
    }
    sqlite3_free(zErrmsg);
  }
}